

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_set_format.c
# Opt level: O3

void test_read_set_format(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive_conflict *a;
  char *pcVar4;
  time_t tVar5;
  la_int64_t lVar6;
  la_ssize_t lVar7;
  char test_txt [21];
  archive_entry *ae;
  char reffile [25];
  char buff [64];
  char local_b8 [24];
  archive_entry *local_a0;
  char local_98 [32];
  undefined1 local_78 [72];
  
  builtin_strncpy(local_98 + 0x10,"_rar.rar",9);
  builtin_strncpy(local_98,"test_read_format",0x10);
  builtin_strncpy(local_b8,"test text document\r\n",0x15);
  extract_reference_file(local_98);
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'\'',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_set_format((archive *)a,0xd0000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'(',(uint)(iVar1 == 0),"0 == archive_read_set_format(a, ARCHIVE_FORMAT_RAR)",a)
  ;
  iVar1 = archive_read_append_filter((archive *)a,0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L')',(uint)(iVar1 == 0),
                   "0 == archive_read_append_filter(a, ARCHIVE_FILTER_NONE)",a);
  wVar2 = archive_read_open_filename(a,local_98,0x2800);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'*',(uint)(wVar2 == L'\0'),"0 == archive_read_open_filename(a, reffile, 10240)"
                   ,a);
  iVar1 = archive_read_next_header((archive *)a,&local_a0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'-',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(local_a0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
             ,L'.',"test.txt","\"test.txt\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar5 = archive_entry_mtime(local_a0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'/',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a);
  tVar5 = archive_entry_ctime(local_a0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'0',(wchar_t)tVar5,"(int)archive_entry_ctime(ae)",a);
  tVar5 = archive_entry_atime(local_a0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'1',(wchar_t)tVar5,"(int)archive_entry_atime(ae)",a);
  lVar6 = archive_entry_size(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'2',0x14,"20",lVar6,"archive_entry_size(ae)",(void *)0x0);
  mVar3 = archive_entry_mode(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'3',0x81a4,"33188",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  lVar7 = archive_read_data((archive *)a,local_78,0x14);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'4',(uint)(lVar7 == 0x14),"size == archive_read_data(a, buff, size)",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'5',local_78,"buff",local_b8,"test_txt",0x14,"size",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)a,&local_a0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'8',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(local_a0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
             ,L'9',"testlink","\"testlink\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar5 = archive_entry_mtime(local_a0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L':',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a);
  tVar5 = archive_entry_ctime(local_a0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L';',(wchar_t)tVar5,"(int)archive_entry_ctime(ae)",a);
  tVar5 = archive_entry_atime(local_a0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'<',(wchar_t)tVar5,"(int)archive_entry_atime(ae)",a);
  lVar6 = archive_entry_size(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'=',0,"0",lVar6,"archive_entry_size(ae)",(void *)0x0);
  mVar3 = archive_entry_mode(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'>',0xa1ff,"41471",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  pcVar4 = archive_entry_symlink(local_a0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
             ,L'?',"test.txt","\"test.txt\"",pcVar4,"archive_entry_symlink(ae)",(void *)0x0,L'\0');
  lVar7 = archive_read_data((archive *)a,local_78,0x40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'@',0,"0",lVar7,"archive_read_data(a, buff, sizeof(buff))",a);
  iVar1 = archive_read_next_header((archive *)a,&local_a0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'C',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(local_a0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
             ,L'D',"testdir/test.txt","\"testdir/test.txt\"",pcVar4,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  tVar5 = archive_entry_mtime(local_a0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'E',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a);
  tVar5 = archive_entry_ctime(local_a0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'F',(wchar_t)tVar5,"(int)archive_entry_ctime(ae)",a);
  tVar5 = archive_entry_atime(local_a0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'G',(wchar_t)tVar5,"(int)archive_entry_atime(ae)",a);
  lVar6 = archive_entry_size(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'H',0x14,"20",lVar6,"archive_entry_size(ae)",(void *)0x0);
  mVar3 = archive_entry_mode(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'I',0x81a4,"33188",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  lVar7 = archive_read_data((archive *)a,local_78,0x14);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'J',(uint)(lVar7 == 0x14),"size == archive_read_data(a, buff, size)",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'K',local_78,"buff",local_b8,"test_txt",0x14,"size",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)a,&local_a0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'N',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(local_a0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
             ,L'O',"testdir","\"testdir\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar5 = archive_entry_mtime(local_a0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'P',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a);
  tVar5 = archive_entry_ctime(local_a0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'Q',(wchar_t)tVar5,"(int)archive_entry_ctime(ae)",a);
  tVar5 = archive_entry_atime(local_a0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'R',(wchar_t)tVar5,"(int)archive_entry_atime(ae)",a);
  lVar6 = archive_entry_size(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'S',0,"0",lVar6,"archive_entry_size(ae)",(void *)0x0);
  mVar3 = archive_entry_mode(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'T',0x41ed,"16877",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)a,&local_a0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'W',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(local_a0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
             ,L'X',"testemptydir","\"testemptydir\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0
             ,L'\0');
  tVar5 = archive_entry_mtime(local_a0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'Y',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a);
  tVar5 = archive_entry_ctime(local_a0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'Z',(wchar_t)tVar5,"(int)archive_entry_ctime(ae)",a);
  tVar5 = archive_entry_atime(local_a0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'[',(wchar_t)tVar5,"(int)archive_entry_atime(ae)",a);
  lVar6 = archive_entry_size(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'\\',0,"0",lVar6,"archive_entry_size(ae)",(void *)0x0);
  mVar3 = archive_entry_mode(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L']',0x41ed,"16877",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)a,&local_a0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'`',(uint)(iVar1 == 1),"1 == archive_read_next_header(a, &ae)",a);
  iVar1 = archive_file_count((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'a',5,"5",(long)iVar1,"archive_file_count(a)",(void *)0x0);
  iVar1 = archive_read_close((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'b',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a);
  iVar1 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'c',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_set_format)
{
  char buff[64];
  const char reffile[] = "test_read_format_rar.rar";
  const char test_txt[] = "test text document\r\n";
  int size = sizeof(test_txt)-1;
  struct archive_entry *ae;
  struct archive *a;

  extract_reference_file(reffile);
  assert((a = archive_read_new()) != NULL);
  assertA(0 == archive_read_set_format(a, ARCHIVE_FORMAT_RAR));
  assertA(0 == archive_read_append_filter(a, ARCHIVE_FILTER_NONE));
  assertA(0 == archive_read_open_filename(a, reffile, 10240));

  /* First header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("test.txt", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(20, archive_entry_size(ae));
  assertEqualInt(33188, archive_entry_mode(ae));
  assertA(size == archive_read_data(a, buff, size));
  assertEqualMem(buff, test_txt, size);

  /* Second header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("testlink", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(0, archive_entry_size(ae));
  assertEqualInt(41471, archive_entry_mode(ae));
  assertEqualString("test.txt", archive_entry_symlink(ae));
  assertEqualIntA(a, 0, archive_read_data(a, buff, sizeof(buff)));

  /* Third header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("testdir/test.txt", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(20, archive_entry_size(ae));
  assertEqualInt(33188, archive_entry_mode(ae));
  assertA(size == archive_read_data(a, buff, size));
  assertEqualMem(buff, test_txt, size);

  /* Fourth header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("testdir", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(0, archive_entry_size(ae));
  assertEqualInt(16877, archive_entry_mode(ae));

  /* Fifth header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("testemptydir", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(0, archive_entry_size(ae));
  assertEqualInt(16877, archive_entry_mode(ae));

  /* Test EOF */
  assertA(1 == archive_read_next_header(a, &ae));
  assertEqualInt(5, archive_file_count(a));
  assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
  assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}